

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::DeviceContextVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::DeviceContextVkImpl> *this,DeviceContextVkImpl *pObj)

{
  DeviceContextVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::DeviceContextVkImpl> *this_local;
  
  this->m_pObject = pObj;
  if (this->m_pObject != (DeviceContextVkImpl *)0x0) {
    RefCountedObject<Diligent::IDeviceContextVk>::AddRef
              ((RefCountedObject<Diligent::IDeviceContextVk> *)this->m_pObject);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }